

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtree.c
# Opt level: O0

void ts_subtree__write_dot_string(FILE *f,char *string)

{
  char *local_20;
  char *c;
  char *string_local;
  FILE *f_local;
  
  for (local_20 = string; *local_20 != '\0'; local_20 = local_20 + 1) {
    if (*local_20 == '\"') {
      fputs("\\\"",(FILE *)f);
    }
    else if (*local_20 == '\n') {
      fputs("\\n",(FILE *)f);
    }
    else {
      fputc((int)*local_20,(FILE *)f);
    }
  }
  return;
}

Assistant:

static void ts_subtree__write_dot_string(FILE *f, const char *string) {
  for (const char *c = string; *c; c++) {
    if (*c == '"') {
      fputs("\\\"", f);
    } else if (*c == '\n') {
      fputs("\\n", f);
    } else {
      fputc(*c, f);
    }
  }
}